

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O1

bool __thiscall sptk::reaper::FFT::flog_mag(FFT *this,float *x,float *y,float *z,int n)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  
  if (0 < n && (z != (float *)0x0 && (y != (float *)0x0 && x != (float *)0x0))) {
    lVar2 = (ulong)(uint)n << 2;
    do {
      fVar3 = *(float *)((long)x + lVar2 + -4);
      fVar4 = *(float *)((long)y + lVar2 + -4);
      fVar3 = fVar3 * fVar3 + fVar4 * fVar4;
      fVar4 = -200.0;
      if (0.0 < fVar3) {
        fVar4 = log10f(fVar3);
        fVar4 = fVar4 * 10.0;
      }
      pfVar1 = (float *)((long)z + lVar2 + -4);
      *pfVar1 = fVar4;
      lVar2 = lVar2 + -4;
    } while (z < pfVar1);
  }
  return (z != (float *)0x0 && (y != (float *)0x0 && x != (float *)0x0)) && n != 0;
}

Assistant:

bool FFT::flog_mag(float *x, float *y, float *z, int n) {
  float *xp, *yp, *zp, t1, t2, ssq;

  if (x && y && z && n) {
    for (xp = x + n, yp = y + n, zp = z + n; zp > z;) {
      t1 = *--xp;
      t2 = *--yp;
      ssq = (t1 * t1) + (t2 * t2);
      *--zp = (ssq > 0.0)? 10.0 * log10(ssq) : -200.0;
    }
    return true;
  } else {
    return false;
  }
}